

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

void __thiscall
BasicContainer::BasicContainer
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list)

{
  const_reference ppBVar1;
  AABox *b;
  AABox *pAVar2;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *in_RSI;
  Primitive *in_RDI;
  int i;
  treenode **in_stack_000001c0;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *in_stack_000001c8;
  BasicContainer *in_stack_000001d0;
  char (*in_stack_ffffffffffffff48) [11];
  unsigned_long *in_stack_ffffffffffffff50;
  char (*in_stack_ffffffffffffff58) [20];
  ConsoleLogger *this_00;
  undefined1 local_8c [24];
  _func_int **local_74;
  undefined4 local_6c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar3;
  Primitive local_58;
  _func_int **local_50;
  _func_int **local_48;
  size_type local_18;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *local_10;
  
  local_10 = in_RSI;
  Primitive::Primitive(in_RDI);
  in_RDI->_vptr_Primitive = (_func_int **)&PTR_intersect_001e8008;
  AABox::AABox((AABox *)(in_RDI + 1));
  this_00 = (ConsoleLogger *)(in_RDI + 4);
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector
            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  in_RDI[7]._vptr_Primitive = (_func_int **)0x0;
  local_18 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(local_10);
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[11]>
            (this_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector
            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  build(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector
            ((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)this_00);
  ppBVar1 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[](local_10,0)
  ;
  (*((*ppBVar1)->super_Primitive)._vptr_Primitive[1])(&local_58);
  in_RDI[1]._vptr_Primitive = local_58._vptr_Primitive;
  in_RDI[2]._vptr_Primitive = local_50;
  in_RDI[3]._vptr_Primitive = local_48;
  iVar3 = 1;
  while( true ) {
    b = (AABox *)(long)iVar3;
    pAVar2 = (AABox *)std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size
                                (local_10);
    if (pAVar2 <= b) break;
    ppBVar1 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        (local_10,(long)iVar3);
    (*((*ppBVar1)->super_Primitive)._vptr_Primitive[1])(local_8c);
    ::operator+((AABox *)this_00,b);
    in_RDI[1]._vptr_Primitive = local_74;
    in_RDI[2]._vptr_Primitive = (_func_int **)CONCAT44(in_stack_ffffffffffffff98,local_6c);
    in_RDI[3]._vptr_Primitive =
         (_func_int **)CONCAT44(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

BasicContainer(const std::vector<BasicPrimitive*>& list): list(list)
	{
		console.log("building SAH BVH of", list.size(), "primitives");
		build(list, root);
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
	}